

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhosgPNGConv.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  DataPtrs local_c0;
  char *local_b8;
  Image local_b0;
  Image local_78;
  undefined1 local_50 [8];
  Image img;
  char *dst_filename;
  char *src_filename;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    local_b8 = (char *)0x0;
  }
  else {
    local_b8 = argv[1];
  }
  if (argc < 3) {
    local_c0.raw = (char *)0x0;
  }
  else {
    local_c0 = *(DataPtrs *)(argv + 2);
  }
  img.data = local_c0;
  if (argc < 4) {
    phosg::Image::Image((Image *)local_50);
    if ((local_b8 == (char *)0x0) || (iVar1 = strcmp(local_b8,"-"), iVar1 == 0)) {
      phosg::Image::Image(&local_78,_stdin);
      phosg::Image::operator=((Image *)local_50,&local_78);
      phosg::Image::~Image(&local_78);
    }
    else {
      phosg::Image::Image(&local_b0,local_b8);
      phosg::Image::operator=((Image *)local_50,&local_b0);
      phosg::Image::~Image(&local_b0);
    }
    if ((img.data.raw == (void *)0x0) || (iVar1 = strcmp((char *)img.data.as8,"-"), iVar1 == 0)) {
      phosg::Image::save((Image *)local_50,_stdout,PNG);
    }
    else {
      phosg::Image::save((Image *)local_50,(char *)img.data.as8,PNG);
    }
    phosg::Image::~Image((Image *)local_50);
    return 0;
  }
  fprintf(_stderr,"too many positional arguments given\n");
  return 1;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  Image img;
  if (!src_filename || !strcmp(src_filename, "-")) {
    img = Image(stdin);
  } else {
    img = Image(src_filename);
  }

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    img.save(stdout, Image::Format::PNG);
  } else {
    img.save(dst_filename, Image::Format::PNG);
  }

  return 0;
}